

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

int Str_MuxTryOnce(Gia_Man_t *pNew,Str_Ntk_t *pNtk,Str_Mux_t *pTree,Str_Mux_t *pRoot,int Edge,
                  Vec_Int_t *vDelay,int fVerbose)

{
  Str_Mux_t *pTree_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint i;
  uint k;
  uint uVar4;
  int nLength;
  Str_Mux_t pBackup [3];
  int pPath [500];
  Vec_Int_t *pVVar5;
  uint local_908;
  uint local_904;
  Str_Mux_t *local_900;
  uint local_8f8;
  uint local_8f4;
  uint local_8f0;
  int local_8ec;
  uint local_8e8;
  uint local_8e4;
  Str_Mux_t *local_8e0;
  Vec_Int_t *local_8d8;
  Gia_Man_t *local_8d0;
  Str_Mux_t local_8c8 [3];
  int local_808 [502];
  
  local_8e0 = pTree;
  uVar1 = Str_MuxDelayEdge_rec(pRoot,Edge);
  local_904 = 0;
  local_900 = pRoot;
  local_8ec = Edge;
  iVar2 = Str_MuxFindPathEdge_rec(pRoot,Edge,local_808,(int *)&local_904);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    if (fVerbose != 0) {
      printf("Trying node %d with path of length %d.\n",(ulong)(uint)local_900->Id,(ulong)local_904)
      ;
    }
    local_8f8 = uVar1;
    local_8d8 = vDelay;
    local_8d0 = pNew;
    if ((int)local_904 < 1) {
      uVar4 = 0;
      local_908 = 0xffffffff;
    }
    else {
      local_908 = 0xffffffff;
      uVar4 = 0;
      i = 0;
      local_8f0 = local_904;
      uVar3 = local_904;
      do {
        k = i + 2;
        if ((int)k < (int)uVar3) {
          local_8f4 = i << 0x10;
          do {
            pTree_00 = local_8e0;
            local_8e8 = uVar1;
            local_8e4 = uVar4;
            Str_MuxChangeOnce(local_8e0,local_808,i,k,local_8c8,(Gia_Man_t *)0x0,(Vec_Int_t *)0x0);
            uVar3 = Str_MuxDelayEdge_rec(local_900,local_8ec);
            uVar1 = local_8e8;
            Str_MuxChangeUndo(pTree_00,local_808,i,k,local_8c8);
            uVar4 = local_8e4;
            if (((int)uVar3 < (int)uVar1) || ((0 < (int)local_908 && (uVar1 == uVar3)))) {
              local_908 = k | local_8f4;
              uVar1 = uVar3;
            }
            if (fVerbose != 0) {
              printf("%2d %2d -> %3d (%3d)\n",(ulong)i,(ulong)k,(ulong)uVar3);
            }
            uVar4 = uVar4 + 1;
            k = k + 1;
            uVar3 = local_8f0;
          } while (local_8f0 != k);
        }
        i = i + 1;
      } while (i != uVar3);
    }
    if (local_908 == 0xffffffff) {
      iVar2 = 0;
      if (fVerbose != 0) {
        puts("Did not find!");
        iVar2 = 0;
      }
    }
    else {
      pVVar5 = local_8d8;
      Str_MuxChangeOnce(local_8e0,local_808,(int)local_908 >> 0x10,local_908 & 0xffff,
                        (Str_Mux_t *)0x0,local_8d0,local_8d8);
      iVar2 = 1;
      if (fVerbose != 0) {
        printf("Node %6d (%3d %3d) : Checks = %d. Delay: %d -> %d.\n",(ulong)(uint)local_900->Id,
               (ulong)(uint)((int)local_908 >> 0x10),(ulong)(local_908 & 0xffff),(ulong)uVar4,
               (ulong)local_8f8,CONCAT44((int)((ulong)pVVar5 >> 0x20),uVar1));
        putchar(10);
      }
    }
  }
  return iVar2;
}

Assistant:

int Str_MuxTryOnce( Gia_Man_t * pNew, Str_Ntk_t * pNtk, Str_Mux_t * pTree, Str_Mux_t * pRoot, int Edge, Vec_Int_t * vDelay, int fVerbose )
{
    int pPath[500];
    Str_Mux_t pBackup[3];
    int Delay, DelayBest = Str_MuxDelayEdge_rec( pRoot, Edge ), DelayInit = DelayBest;
    int i, k, nLength = 0, ForkBest = -1, nChecks = 0;
    int RetValue = Str_MuxFindPathEdge_rec( pRoot, Edge, pPath, &nLength );
    if ( RetValue == 0 )
        return 0;
    if ( fVerbose )
        printf( "Trying node %d with path of length %d.\n", pRoot->Id, nLength );
    for ( i = 0; i < nLength; i++ )
    for ( k = i+2; k < nLength; k++ )
    {
        Str_MuxChangeOnce( pTree, pPath, i, k, pBackup, NULL, NULL );
        Delay = Str_MuxDelayEdge_rec( pRoot, Edge );
        Str_MuxChangeUndo( pTree, pPath, i, k, pBackup );
        if ( DelayBest > Delay || (ForkBest > 0 && DelayBest == Delay) )
            DelayBest = Delay, ForkBest = (i << 16) | k;
        if ( fVerbose )
            printf( "%2d %2d -> %3d (%3d)\n", i, k, Delay, DelayBest );
        nChecks++;
    }
    if ( ForkBest == -1 )
    {
        if ( fVerbose )
            printf( "Did not find!\n" );
        return 0;
    }
//    Str_MuxDelayPrint_rec( pRoot, Edge ); printf( "\n" );
    Str_MuxChangeOnce( pTree, pPath, ForkBest >> 16, ForkBest & 0xFFFF, NULL, pNew, vDelay );
//    Str_MuxDelayPrint_rec( pRoot, Edge ); printf( "\n" );
    if ( fVerbose )
        printf( "Node %6d (%3d %3d) : Checks = %d. Delay: %d -> %d.\n", 
            pRoot->Id, ForkBest >> 16, ForkBest & 0xFFFF, nChecks, DelayInit, DelayBest );
    if ( fVerbose )
        printf( "\n" );
    return 1;
}